

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.h
# Opt level: O0

PixOrCopy PixOrCopyCreateCacheIdx(int idx)

{
  PixOrCopy PVar1;
  int idx_local;
  PixOrCopy retval;
  
  PVar1._1_1_ = retval._1_1_;
  PVar1.mode = 1;
  PVar1.len = 1;
  PVar1.argb_or_distance = idx;
  return PVar1;
}

Assistant:

static WEBP_INLINE PixOrCopy PixOrCopyCreateCacheIdx(int idx) {
  PixOrCopy retval;
  assert(idx >= 0);
  assert(idx < (1 << MAX_COLOR_CACHE_BITS));
  retval.mode = kCacheIdx;
  retval.argb_or_distance = idx;
  retval.len = 1;
  return retval;
}